

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::EvaluateErrorT<std::complex<double>>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,TPZVec<double> *errors,
          bool store_errors)

{
  _func_int *p_Var1;
  int iVar2;
  long lVar3;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5> *this_00;
  long *plVar4;
  TPZIntPoints *pTVar5;
  int *piVar6;
  TPZGeoEl *pTVar7;
  int64_t iVar8;
  TPZMaterialDataT<std::complex<double>_> *pTVar9;
  double *pdVar10;
  TPZCompMesh *this_01;
  byte in_DL;
  TPZVec<double> *in_RSI;
  TPZCompEl *in_RDI;
  int ier_2;
  TPZFMatrix<double> *elvals;
  int64_t index;
  int ier_1;
  int ier;
  int nint;
  TPZGeoEl *ref;
  REAL detJac;
  TPZFNMatrix<9,_double> jacInv;
  TPZFNMatrix<9,_double> axe;
  TPZFNMatrix<9,_double> jac;
  int nintpoints;
  TPZManVector<TPZTransform<double>,_10> trvec;
  uint i;
  int iactive;
  int64_t nref;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5> datavec;
  REAL weight;
  TPZManVector<double,_10> values;
  TPZManVector<double,_10> intpoint;
  TPZFNMatrix<3,_double> du_exact;
  TPZManVector<double,_10> u_exact;
  int ndof;
  int order_limit;
  TPZManVector<int,_3> maxorder;
  TPZManVector<int,_3> prevorder;
  int maxIntOrder;
  TPZAutoPointer<TPZIntPoints> intrule;
  int dim;
  int NErrors;
  TPZMatErrorCombinedSpaces<std::complex<double>_> *matError;
  TPZMatCombinedSpacesT<std::complex<double>_> *mat;
  TPZNullMaterialCS<std::complex<double>_> *nullmat;
  int64_t in_stack_fffffffffffc9f38;
  _func_int **pp_Var11;
  TPZSolutionMatrix *in_stack_fffffffffffc9f40;
  TPZCompEl *in_stack_fffffffffffc9f48;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5> *in_stack_fffffffffffc9f50;
  TPZIntPoints *in_stack_fffffffffffc9f58;
  TPZFNMatrix<3,_double> *in_stack_fffffffffffc9f60;
  int64_t in_stack_fffffffffffc9f68;
  TPZManVector<int,_3> *in_stack_fffffffffffc9f70;
  int64_t in_stack_fffffffffffc9f78;
  double dVar12;
  int64_t in_stack_fffffffffffc9f80;
  double dVar13;
  double *in_stack_fffffffffffc9f88;
  TPZVec<double> *in_stack_fffffffffffc9f90;
  undefined4 in_stack_fffffffffffc9fd8;
  long lStack_36010;
  long lStack_36000;
  int iStack_35fe4;
  int iStack_35fcc;
  int in_stack_fffffffffffca038;
  uint uVar14;
  TPZFMatrix<double> *in_stack_fffffffffffca048;
  TPZFMatrix<double> *in_stack_fffffffffffca050;
  TPZVec<double> *in_stack_fffffffffffca058;
  TPZGeoEl *in_stack_fffffffffffca060;
  TPZCompEl *in_stack_fffffffffffca120;
  undefined1 auStack_35d08 [96];
  size_t in_stack_fffffffffffca358;
  char *in_stack_fffffffffffca360;
  uint uStack_34ca8;
  uint uStack_34ca4;
  TPZVec<TPZMaterialDataT<std::complex<double>_>_> aTStack_34c98 [6733];
  double local_2e8 [2];
  TPZVec<double> local_2d8 [3];
  undefined1 local_268 [400];
  undefined4 local_d8;
  undefined4 local_d4;
  undefined1 local_d0 [48];
  TPZVec<int> local_a0 [2];
  int local_5c;
  TPZAutoPointer<TPZIntPoints> local_58;
  undefined4 local_4c;
  undefined8 local_48;
  int local_3c;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5> *local_38;
  long local_30;
  long local_28;
  undefined8 local_20;
  byte local_11;
  TPZVec<double> *local_10;
  
  local_11 = in_DL & 1;
  local_20 = 0;
  local_10 = in_RSI;
  TPZVec<double>::Fill
            (in_stack_fffffffffffc9f90,in_stack_fffffffffffc9f88,in_stack_fffffffffffc9f80,
             in_stack_fffffffffffc9f78);
  lVar3 = (**(code **)(*(long *)in_RDI + 0xb8))();
  if (lVar3 == 0) {
    lStack_36000 = 0;
  }
  else {
    lStack_36000 = __dynamic_cast(lVar3,&TPZMaterial::typeinfo,
                                  &TPZNullMaterialCS<std::complex<double>>::typeinfo,0);
  }
  local_28 = lStack_36000;
  if (lStack_36000 == 0) {
    lVar3 = (**(code **)(*(long *)in_RDI + 0xb8))();
    if (lVar3 == 0) {
      lStack_36010 = 0;
    }
    else {
      lStack_36010 = __dynamic_cast(lVar3,&TPZMaterial::typeinfo,
                                    &TPZMatCombinedSpacesT<std::complex<double>>::typeinfo,
                                    0xfffffffffffffffe);
    }
    local_30 = lStack_36010;
    if (lStack_36010 == 0) {
      this_00 = (TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5> *)0x0;
    }
    else {
      this_00 = (TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5> *)
                __dynamic_cast(lStack_36010,&TPZMatCombinedSpacesT<std::complex<double>>::typeinfo,
                               &TPZMatErrorCombinedSpaces<std::complex<double>>::typeinfo,
                               0xfffffffffffffffe);
    }
    local_38 = this_00;
    if (local_30 == 0) {
      std::operator<<((ostream *)&std::cerr,
                      "void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::EvaluateErrorT(TPZVec<REAL> &, bool) [TGeometry = pzgeom::TPZGeoTetrahedra, TVar = std::complex<double>]"
                     );
      std::operator<<((ostream *)&std::cerr," no material for this element\n");
    }
    else if (this_00 == (TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5> *)0x0) {
      std::operator<<((ostream *)&std::cerr,
                      "void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::EvaluateErrorT(TPZVec<REAL> &, bool) [TGeometry = pzgeom::TPZGeoTetrahedra, TVar = std::complex<double>]"
                     );
      std::operator<<((ostream *)&std::cerr," no error interface for this element.\n");
      std::operator<<((ostream *)&std::cerr,"See TPZMatErrorCombinedSpaces\n");
    }
    else {
      p_Var1 = (this_00->super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>)._vptr_TPZVec[-3];
      local_3c = (*(code *)**(undefined8 **)
                             (p_Var1 + -0x20 +
                             (long)&this_00->fExtAlloc[0].super_TPZMaterialData.super_TPZShapeData))
                           (p_Var1 + -0x20 +
                            (long)&this_00->fExtAlloc[0].super_TPZMaterialData.super_TPZShapeData);
      (*local_10->_vptr_TPZVec[3])(local_10,(long)local_3c);
      local_48 = 0;
      TPZVec<double>::Fill
                (in_stack_fffffffffffc9f90,in_stack_fffffffffffc9f88,in_stack_fffffffffffc9f80,
                 in_stack_fffffffffffc9f78);
      iVar2 = (**(code **)(*(long *)in_RDI + 0x90))();
      if (iVar2 != 0) {
        local_4c = (**(code **)(*(long *)in_RDI + 0xb0))();
        plVar4 = (long *)(**(code **)(*(long *)in_RDI + 0x2d8))();
        (**(code **)(*plVar4 + 0x48))();
        TPZAutoPointer<TPZIntPoints>::TPZAutoPointer
                  ((TPZAutoPointer<TPZIntPoints> *)in_stack_fffffffffffc9f60,
                   in_stack_fffffffffffc9f58);
        pTVar5 = TPZAutoPointer<TPZIntPoints>::operator->(&local_58);
        iVar2 = (*pTVar5->_vptr_TPZIntPoints[7])();
        local_5c = iVar2;
        TPZManVector<int,_3>::TPZManVector
                  ((TPZManVector<int,_3> *)in_stack_fffffffffffc9f60,
                   (int64_t)in_stack_fffffffffffc9f58);
        TPZManVector<int,_3>::TPZManVector
                  (in_stack_fffffffffffc9f70,in_stack_fffffffffffc9f68,
                   (int *)in_stack_fffffffffffc9f60);
        pTVar5 = TPZAutoPointer<TPZIntPoints>::operator->(&local_58);
        (*pTVar5->_vptr_TPZIntPoints[6])(pTVar5,local_a0);
        local_d4 = 0xf;
        if (0xf < local_5c) {
          piVar6 = TPZVec<int>::operator[](local_a0,0);
          if (*piVar6 < 0x10) {
            local_5c = 0xf;
          }
          else {
            piVar6 = TPZVec<int>::operator[](local_a0,0);
            local_5c = *piVar6;
          }
        }
        pTVar5 = TPZAutoPointer<TPZIntPoints>::operator->(&local_58);
        (*pTVar5->_vptr_TPZIntPoints[5])(pTVar5,local_d0,0);
        plVar4 = (long *)(**(code **)(*(long *)in_RDI + 0xb8))();
        local_d8 = (**(code **)(*plVar4 + 0x78))();
        TPZManVector<double,_10>::TPZManVector
                  ((TPZManVector<double,_10> *)in_stack_fffffffffffc9f60,
                   (int64_t)in_stack_fffffffffffc9f58);
        TPZFNMatrix<3,_double>::TPZFNMatrix
                  (in_stack_fffffffffffc9f60,(int64_t)in_stack_fffffffffffc9f58,
                   (int64_t)in_stack_fffffffffffc9f50);
        pTVar7 = TPZCompEl::Reference(in_stack_fffffffffffc9f48);
        (**(code **)(*(long *)pTVar7 + 0x210))();
        TPZManVector<double,_10>::TPZManVector
                  ((TPZManVector<double,_10> *)in_stack_fffffffffffc9f60,
                   (int64_t)in_stack_fffffffffffc9f58);
        TPZManVector<double,_10>::TPZManVector
                  ((TPZManVector<double,_10> *)in_stack_fffffffffffc9f60,
                   (int64_t)in_stack_fffffffffffc9f58);
        local_2e8[1] = 0.0;
        TPZVec<double>::Fill
                  (in_stack_fffffffffffc9f90,in_stack_fffffffffffc9f88,in_stack_fffffffffffc9f80,
                   in_stack_fffffffffffc9f78);
        TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5>::TPZManVector
                  (this_00,CONCAT44(iVar2,in_stack_fffffffffffc9fd8));
        iVar8 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 3));
        TPZVec<TPZMaterialDataT<std::complex<double>_>_>::resize
                  ((TPZVec<TPZMaterialDataT<std::complex<double>_>_> *)in_stack_fffffffffffc9f40,
                   in_stack_fffffffffffc9f38);
        (**(code **)(*(long *)in_RDI + 0x290))(in_RDI,aTStack_34c98,0);
        uStack_34ca4 = 0xffffffff;
        for (uStack_34ca8 = 0; (long)(ulong)uStack_34ca8 < iVar8; uStack_34ca8 = uStack_34ca8 + 1) {
          pTVar9 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                             (aTStack_34c98,(ulong)uStack_34ca8);
          if ((pTVar9->super_TPZMaterialData).super_TPZShapeData.fShapeType != EEmpty) {
            pTVar9 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                               (aTStack_34c98,(ulong)uStack_34ca8);
            (pTVar9->super_TPZMaterialData).fNeedsSol = true;
            uStack_34ca4 = uStack_34ca8;
          }
        }
        if (uStack_34ca4 == 0xffffffff) {
          pzinternal::DebugStopImpl(in_stack_fffffffffffca360,in_stack_fffffffffffca358);
        }
        TPZManVector<TPZTransform<double>,_10>::TPZManVector
                  ((TPZManVector<TPZTransform<double>,_10> *)this_00,
                   CONCAT44(iVar2,in_stack_fffffffffffc9fd8));
        (**(code **)(*(long *)in_RDI + 0x280))(in_RDI,auStack_35d08);
        pTVar5 = TPZAutoPointer<TPZIntPoints>::operator->(&local_58);
        iVar2 = (*pTVar5->_vptr_TPZIntPoints[3])();
        TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)in_stack_fffffffffffc9f50);
        TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)in_stack_fffffffffffc9f50);
        TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)in_stack_fffffffffffc9f50);
        pTVar7 = TPZCompEl::Reference(in_stack_fffffffffffc9f48);
        for (uVar14 = 0; (int)uVar14 < iVar2; uVar14 = uVar14 + 1) {
          pTVar5 = TPZAutoPointer<TPZIntPoints>::operator->(&local_58);
          (*pTVar5->_vptr_TPZIntPoints[4])(pTVar5,(ulong)uVar14,local_268,local_2e8);
          TPZGeoEl::Jacobian(in_stack_fffffffffffca060,in_stack_fffffffffffca058,
                             in_stack_fffffffffffca050,in_stack_fffffffffffca048,(REAL *)pTVar7,
                             (TPZFMatrix<double> *)CONCAT44(uVar14,in_stack_fffffffffffca038));
          (**(code **)(*(long *)in_RDI + 0x2b0))(in_RDI,local_268,auStack_35d08,aTStack_34c98);
          local_2e8[0] = local_2e8[0] * ABS((double)in_stack_fffffffffffca048);
          (**(local_38->super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>)._vptr_TPZVec)
                    (local_38,aTStack_34c98,local_2d8);
          for (in_stack_fffffffffffca038 = 0; in_stack_fffffffffffca038 < local_3c;
              in_stack_fffffffffffca038 = in_stack_fffffffffffca038 + 1) {
            pdVar10 = TPZVec<double>::operator[](local_2d8,(long)in_stack_fffffffffffca038);
            dVar12 = *pdVar10;
            dVar13 = local_2e8[0];
            pdVar10 = TPZVec<double>::operator[](local_10,(long)in_stack_fffffffffffca038);
            *pdVar10 = dVar12 * dVar13 + *pdVar10;
          }
        }
        for (iStack_35fcc = 0; iStack_35fcc < local_3c; iStack_35fcc = iStack_35fcc + 1) {
          pdVar10 = TPZVec<double>::operator[](local_10,(long)iStack_35fcc);
          in_stack_fffffffffffc9f60 = (TPZFNMatrix<3,_double> *)sqrt(*pdVar10);
          pdVar10 = TPZVec<double>::operator[](local_10,(long)iStack_35fcc);
          *pdVar10 = (double)in_stack_fffffffffffc9f60;
        }
        if ((local_11 & 1) != 0) {
          TPZCompEl::Index(in_RDI);
          this_01 = TPZCompEl::Mesh(in_stack_fffffffffffca120);
          TPZCompMesh::ElementSolution(this_01);
          in_stack_fffffffffffc9f50 =
               (TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5> *)
               TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_fffffffffffc9f40);
          iVar8 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_stack_fffffffffffc9f50);
          if (iVar8 < local_3c) {
            std::operator<<((ostream *)&std::cout,
                            "The element solution of the mesh should be resized before EvaluateError\n"
                           );
            pzinternal::DebugStopImpl(in_stack_fffffffffffca360,in_stack_fffffffffffca358);
          }
          for (iStack_35fe4 = 0; iStack_35fe4 < local_3c; iStack_35fe4 = iStack_35fe4 + 1) {
            pdVar10 = TPZVec<double>::operator[](local_10,(long)iStack_35fe4);
            pp_Var11 = (_func_int **)*pdVar10;
            in_stack_fffffffffffc9f40 =
                 (TPZSolutionMatrix *)
                 TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffc9f60->super_TPZFMatrix<double>,(int64_t)this_01,
                            (int64_t)in_stack_fffffffffffc9f50);
            (in_stack_fffffffffffc9f40->super_TPZSavable)._vptr_TPZSavable = pp_Var11;
          }
        }
        pTVar5 = TPZAutoPointer<TPZIntPoints>::operator->(&local_58);
        (*pTVar5->_vptr_TPZIntPoints[5])(pTVar5,local_a0,0);
        TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1b82f72);
        TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1b82f7f);
        TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1b82f8c);
        TPZManVector<TPZTransform<double>,_10>::~TPZManVector
                  ((TPZManVector<TPZTransform<double>,_10> *)in_stack_fffffffffffc9f50);
        TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5>::~TPZManVector
                  (in_stack_fffffffffffc9f50);
        TPZManVector<double,_10>::~TPZManVector
                  ((TPZManVector<double,_10> *)in_stack_fffffffffffc9f40);
        TPZManVector<double,_10>::~TPZManVector
                  ((TPZManVector<double,_10> *)in_stack_fffffffffffc9f40);
        TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x1b82fcd);
        TPZManVector<double,_10>::~TPZManVector
                  ((TPZManVector<double,_10> *)in_stack_fffffffffffc9f40);
        TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffc9f40);
        TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffc9f40);
        TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZIntPoints> *)in_stack_fffffffffffc9f40);
      }
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::EvaluateErrorT(TPZVec<REAL> &errors, bool store_errors) {
  errors.Fill(0.);
  auto *nullmat = dynamic_cast<TPZNullMaterialCS<TVar> *>(this->Material());
    if(nullmat) return;
  auto *mat =
      dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(this->Material());
  auto *matError =
      dynamic_cast<TPZMatErrorCombinedSpaces<TVar>*>(mat);
  
  //TPZMaterial * matptr = material.operator->();
  if (!mat) {
      PZError << __PRETTY_FUNCTION__;
      PZError<<" no material for this element\n";
      return;
  }
  if(!matError){
      PZError << __PRETTY_FUNCTION__;
      PZError<<" no error interface for this element.\n";
      PZError<<"See TPZMatErrorCombinedSpaces\n";
      return;
  }
      
  const int NErrors = matError->NEvalErrors();
  errors.Resize(NErrors);
  errors.Fill(0.);

  // Return if BC
  if (this->NConnects() == 0) return;

  // Adjust the order of the integration rule
  int dim = Dimension();
  TPZAutoPointer<TPZIntPoints> intrule = this->GetIntegrationRule().Clone();
  int maxIntOrder = intrule->GetMaxOrder();
  TPZManVector<int, 3> prevorder(dim), maxorder(dim, maxIntOrder);
  intrule->GetOrder(prevorder);
  const int order_limit = 15;
  if (maxIntOrder > order_limit) {
    if (prevorder[0] > order_limit) {
      maxIntOrder = prevorder[0];
    } else {
      maxIntOrder = order_limit;
    }
  }

  intrule->SetOrder(maxorder);

  const int ndof = this->Material()->NStateVariables();
  TPZManVector<STATE, 10> u_exact(ndof);
  TPZFNMatrix<3, STATE> du_exact(dim, ndof);
  TPZManVector<REAL, 10> intpoint(Reference()->Dimension()), values(NErrors);
  values.Fill(0.0);
  REAL weight;

  TPZManVector<TPZMaterialDataT<TVar>, 5> datavec;
  const int64_t nref = fElementVec.size();
  datavec.resize(nref);
  InitMaterialData(datavec);
  int iactive = -1;
  for (unsigned int i = 0; i < nref; ++i) {
    if (datavec[i].fShapeType != TPZMaterialData::EEmpty) {
      datavec[i].fNeedsSol = true;
      iactive = i;
    }
  }

  if (iactive == -1) DebugStop();

  TPZManVector<TPZTransform<> > trvec;
  AffineTransform(trvec);

  int nintpoints = intrule->NPoints();
  TPZFNMatrix<9, REAL> jac, axe, jacInv;
  REAL detJac;
  TPZGeoEl *ref = this->Reference();

  for (int nint = 0; nint < nintpoints; nint++) {

    intrule->Point(nint, intpoint, weight);

    ref->Jacobian(intpoint, jac, axe, detJac, jacInv);
    this->ComputeRequiredData(intpoint, trvec, datavec);

    weight *= fabs(detJac);
    matError->Errors(datavec, values);

    for (int ier = 0; ier < NErrors; ier++) {
      errors[ier] += values[ier] * weight;
    }

  }//fim for : integration rule
  //Norma sobre o elemento
  for (int ier = 0; ier < NErrors; ier++) {
    errors[ier] = sqrt(errors[ier]);
  }//for ier

  if (store_errors) {
    int64_t index = Index();
    TPZFMatrix<STATE> &elvals = Mesh()->ElementSolution();
    if (elvals.Cols() < NErrors) {
      std::cout << "The element solution of the mesh should be resized before EvaluateError\n";
      DebugStop();
    }
    for (int ier = 0; ier < NErrors; ier++) {
      elvals(index, ier) = errors[ier];
    }
  }
  intrule->SetOrder(prevorder);
}